

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerBreakpointManager.cxx
# Opt level: O0

SetBreakpointsResponse * __thiscall
cmDebugger::cmDebuggerBreakpointManager::HandleSetBreakpointsRequest
          (SetBreakpointsResponse *__return_storage_ptr__,cmDebuggerBreakpointManager *this,
          SetBreakpointsRequest *request)

{
  ulong uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  size_type sVar3;
  int64_t iVar4;
  vector<cmDebugger::cmDebuggerSourceBreakpoint,std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>>
  *pvVar5;
  const_reference pvVar6;
  mapped_type *pmVar7;
  reference pvVar8;
  reference pvVar9;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar10;
  undefined1 local_368 [8];
  Source dapSrc_1;
  int64_t local_230;
  long local_228;
  ulong local_220;
  size_t i_1;
  undefined1 local_210;
  undefined1 local_208 [8];
  Source dapSrc;
  int64_t local_d0;
  long local_c8;
  int64_t local_c0;
  int64_t correctedLine;
  size_t i;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>,_true>
  local_a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_true>
  local_a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_true>
  local_98;
  vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *local_90;
  vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *breakpoints;
  array<dap::SourceBreakpoint> defaultValue;
  undefined1 local_58 [8];
  string sourcePath;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  SetBreakpointsRequest *request_local;
  cmDebuggerBreakpointManager *this_local;
  SetBreakpointsResponse *response;
  
  lock._8_8_ = request;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->Mutex);
  sourcePath.field_2._M_local_buf[0xf] = '\0';
  dap::SetBreakpointsResponse::SetBreakpointsResponse(__return_storage_ptr__);
  p = dap::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(lock._8_8_ + 0xf0));
  cmsys::SystemTools::GetActualCaseForPath((string *)local_58,p);
  breakpoints = (vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *)0x0;
  defaultValue.super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  defaultValue.super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::vector
            ((vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *)&breakpoints);
  local_90 = dap::
             optional<std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>_>::
             value((optional<std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>_>
                    *)lock._8_8_,
                   (vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *)
                   &breakpoints);
  local_98._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
       ::find(&this->Breakpoints,(key_type *)local_58);
  local_a0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
       ::end(&this->Breakpoints);
  bVar2 = std::__detail::operator!=(&local_98,&local_a0);
  if (bVar2) {
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
             ::operator[](&this->Breakpoints,(key_type *)local_58);
    std::
    vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
    ::clear(pmVar7);
  }
  sVar3 = std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::size(local_90)
  ;
  std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::resize
            (&__return_storage_ptr__->breakpoints,sVar3);
  local_a8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>_>
       ::find(&this->ListFileFunctionLines,(key_type *)local_58);
  i = (size_t)std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>_>
              ::end(&this->ListFileFunctionLines);
  bVar2 = std::__detail::operator!=
                    (&local_a8,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>,_true>
                      *)&i);
  if (bVar2) {
    for (correctedLine = 0; iVar4 = correctedLine,
        sVar3 = std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::size
                          (local_90), (ulong)iVar4 < sVar3; correctedLine = correctedLine + 1) {
      pvVar6 = std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::
               operator[](local_90,correctedLine);
      iVar4 = dap::integer::operator_cast_to_long(&pvVar6->line);
      local_c0 = CalibrateBreakpointLine(this,(string *)local_58,iVar4);
      if (local_c0 < 1) {
        pvVar9 = std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::operator[]
                           (&__return_storage_ptr__->breakpoints,correctedLine);
        dap::boolean::operator=(&pvVar9->verified,false);
        pvVar6 = std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::
                 operator[](local_90,correctedLine);
        pvVar9 = std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::operator[]
                           (&__return_storage_ptr__->breakpoints,correctedLine);
        dap::optional<dap::integer>::operator=(&pvVar9->line,&pvVar6->line);
      }
      else {
        pvVar5 = (vector<cmDebugger::cmDebuggerSourceBreakpoint,std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>>
                  *)std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
                    ::operator[](&this->Breakpoints,(key_type *)local_58);
        local_c8 = this->NextBreakpointId;
        this->NextBreakpointId = local_c8 + 1;
        std::
        vector<cmDebugger::cmDebuggerSourceBreakpoint,std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>>
        ::emplace_back<long,long&>(pvVar5,&local_c8,&local_c0);
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
                 ::operator[](&this->Breakpoints,(key_type *)local_58);
        pvVar8 = std::
                 vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
                 ::back(pmVar7);
        local_d0 = cmDebuggerSourceBreakpoint::GetId(pvVar8);
        pvVar9 = std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::operator[]
                           (&__return_storage_ptr__->breakpoints,correctedLine);
        dap::optional<dap::integer>::operator=(&pvVar9->id,&local_d0);
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
                 ::operator[](&this->Breakpoints,(key_type *)local_58);
        pvVar8 = std::
                 vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
                 ::back(pmVar7);
        dapSrc.sources._24_8_ = cmDebuggerSourceBreakpoint::GetLine(pvVar8);
        pvVar9 = std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::operator[]
                           (&__return_storage_ptr__->breakpoints,correctedLine);
        dap::optional<dap::integer>::operator=(&pvVar9->line,(long *)&dapSrc.sources.set);
        pvVar9 = std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::operator[]
                           (&__return_storage_ptr__->breakpoints,correctedLine);
        dap::boolean::operator=(&pvVar9->verified,true);
      }
      dap::Source::Source((Source *)local_208);
      dap::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&dapSrc.origin.set,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      pvVar9 = std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::operator[]
                         (&__return_storage_ptr__->breakpoints,correctedLine);
      dap::optional<dap::Source>::operator=(&pvVar9->source,(Source *)local_208);
      dap::Source::~Source((Source *)local_208);
    }
  }
  else {
    pVar10 = std::
             unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::emplace<std::__cxx11::string&>
                       ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&this->ListFilePendingValidations,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58);
    i_1 = (size_t)pVar10.first.
                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ._M_cur;
    local_210 = pVar10.second;
    for (local_220 = 0; uVar1 = local_220,
        sVar3 = std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::size
                          (local_90), uVar1 < sVar3; local_220 = local_220 + 1) {
      pvVar5 = (vector<cmDebugger::cmDebuggerSourceBreakpoint,std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>>
                *)std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
                  ::operator[](&this->Breakpoints,(key_type *)local_58);
      local_228 = this->NextBreakpointId;
      this->NextBreakpointId = local_228 + 1;
      pvVar6 = std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::
               operator[](local_90,local_220);
      std::
      vector<cmDebugger::cmDebuggerSourceBreakpoint,std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>>
      ::emplace_back<long,dap::integer_const&>(pvVar5,&local_228,&pvVar6->line);
      pmVar7 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
               ::operator[](&this->Breakpoints,(key_type *)local_58);
      pvVar8 = std::
               vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
               ::back(pmVar7);
      local_230 = cmDebuggerSourceBreakpoint::GetId(pvVar8);
      pvVar9 = std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::operator[]
                         (&__return_storage_ptr__->breakpoints,local_220);
      dap::optional<dap::integer>::operator=(&pvVar9->id,&local_230);
      pmVar7 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
               ::operator[](&this->Breakpoints,(key_type *)local_58);
      pvVar8 = std::
               vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
               ::back(pmVar7);
      dapSrc_1.sources._24_8_ = cmDebuggerSourceBreakpoint::GetLine(pvVar8);
      pvVar9 = std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::operator[]
                         (&__return_storage_ptr__->breakpoints,local_220);
      dap::optional<dap::integer>::operator=(&pvVar9->line,(long *)&dapSrc_1.sources.set);
      pvVar9 = std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::operator[]
                         (&__return_storage_ptr__->breakpoints,local_220);
      dap::boolean::operator=(&pvVar9->verified,false);
      dap::Source::Source((Source *)local_368);
      dap::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&dapSrc_1.origin.set,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      pvVar9 = std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::operator[]
                         (&__return_storage_ptr__->breakpoints,local_220);
      dap::optional<dap::Source>::operator=(&pvVar9->source,(Source *)local_368);
      dap::Source::~Source((Source *)local_368);
    }
  }
  sourcePath.field_2._M_local_buf[0xf] = '\x01';
  std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::~vector
            ((vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *)&breakpoints);
  std::__cxx11::string::~string((string *)local_58);
  if ((sourcePath.field_2._M_local_buf[0xf] & 1U) == 0) {
    dap::SetBreakpointsResponse::~SetBreakpointsResponse(__return_storage_ptr__);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

dap::SetBreakpointsResponse
cmDebuggerBreakpointManager::HandleSetBreakpointsRequest(
  dap::SetBreakpointsRequest const& request)
{
  std::unique_lock<std::mutex> lock(Mutex);

  dap::SetBreakpointsResponse response;

  auto sourcePath =
    cmSystemTools::GetActualCaseForPath(request.source.path.value());
  const dap::array<dap::SourceBreakpoint> defaultValue{};
  const auto& breakpoints = request.breakpoints.value(defaultValue);

  if (Breakpoints.find(sourcePath) != Breakpoints.end()) {
    Breakpoints[sourcePath].clear();
  }
  response.breakpoints.resize(breakpoints.size());

  if (ListFileFunctionLines.find(sourcePath) != ListFileFunctionLines.end()) {
    // The file has loaded, we can validate breakpoints.
    for (size_t i = 0; i < breakpoints.size(); i++) {
      int64_t correctedLine =
        CalibrateBreakpointLine(sourcePath, breakpoints[i].line);
      if (correctedLine > 0) {
        Breakpoints[sourcePath].emplace_back(NextBreakpointId++,
                                             correctedLine);
        response.breakpoints[i].id = Breakpoints[sourcePath].back().GetId();
        response.breakpoints[i].line =
          Breakpoints[sourcePath].back().GetLine();
        response.breakpoints[i].verified = true;
      } else {
        response.breakpoints[i].verified = false;
        response.breakpoints[i].line = breakpoints[i].line;
      }
      dap::Source dapSrc;
      dapSrc.path = sourcePath;
      response.breakpoints[i].source = dapSrc;
    }
  } else {
    // The file has not loaded, validate breakpoints later.
    ListFilePendingValidations.emplace(sourcePath);

    for (size_t i = 0; i < breakpoints.size(); i++) {
      Breakpoints[sourcePath].emplace_back(NextBreakpointId++,
                                           breakpoints[i].line);
      response.breakpoints[i].id = Breakpoints[sourcePath].back().GetId();
      response.breakpoints[i].line = Breakpoints[sourcePath].back().GetLine();
      response.breakpoints[i].verified = false;
      dap::Source dapSrc;
      dapSrc.path = sourcePath;
      response.breakpoints[i].source = dapSrc;
    }
  }

  return response;
}